

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XObjectContentContext.cpp
# Opt level: O2

void __thiscall FormImageWritingTask::~FormImageWritingTask(FormImageWritingTask *this)

{
  ~FormImageWritingTask(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

virtual ~FormImageWritingTask(){}